

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O2

void test_all_maps<HashObject<8,8>>(int obj_size,int iters)

{
  bool bVar1;
  int i;
  int iVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  long lVar5;
  long lVar6;
  value_type *pvVar7;
  value_type *pvVar8;
  uint *puVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  iterator iVar12;
  _Rb_tree_node_base *p_Var13;
  ulong uVar14;
  size_t sVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  size_type end_memory;
  size_t start_memory;
  size_t start_memory_00;
  size_t start_memory_01;
  size_t start_memory_02;
  size_t start_memory_03;
  size_t start_memory_04;
  size_t start_memory_05;
  size_t start_memory_06;
  size_t start_memory_07;
  size_t start_memory_08;
  size_t start_memory_09;
  size_t start_memory_10;
  size_t start_memory_11;
  size_t start_memory_12;
  size_t start_memory_13;
  size_t start_memory_14;
  size_t start_memory_15;
  size_t start_memory_16;
  size_t start_memory_17;
  size_t start_memory_18;
  size_t start_memory_19;
  size_t start_memory_20;
  size_t start_memory_21;
  size_t start_memory_22;
  size_t start_memory_23;
  size_t start_memory_24;
  size_t start_memory_25;
  size_t start_memory_26;
  uint uVar18;
  uint uVar19;
  int iVar20;
  char acVar21 [4];
  int iVar22;
  int iVar23;
  int iVar24;
  size_type *psVar25;
  size_type req_elements;
  ulong uVar26;
  uint uVar27;
  key_type kVar28;
  float *pfVar29;
  double dVar30;
  key_type local_1e0;
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> set;
  Rusage t;
  two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>_>
  tStack_170;
  iterator iStack_150;
  iterator local_148;
  iterator iStack_140;
  nonempty_iterator local_138;
  int local_124;
  int local_120;
  int local_11c;
  undefined1 local_118 [8];
  iterator iStack_110;
  iterator iStack_f0;
  iterator local_e8;
  iterator iStack_e0;
  nonempty_iterator local_d8;
  double local_c8;
  Rusage t_6;
  double local_b8;
  Rusage t_3;
  iterator iStack_70;
  iterator local_68;
  
  uVar14 = (ulong)(uint)obj_size;
  uVar19 = 0;
  printf("\n%s (%d byte objects, %d iterations):\n","SPARSE_HASH_MAP",8);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar18 = 0;
  if (0 < obj_size) {
    uVar18 = obj_size;
  }
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    pvVar3 = google::
             sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    pvVar3->second = uVar19;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_grow",dVar30,obj_size,start_memory,uVar14);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  req_elements = (size_type)obj_size;
  google::
  sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::resize((sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)&set,req_elements);
  Rusage::Reset(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    pvVar3 = google::
             sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    pvVar3->second = uVar19;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_predict/grow",dVar30,obj_size,start_memory_00,uVar14);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    pvVar3 = google::
             sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    pvVar3->second = uVar19;
  }
  Rusage::Reset(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    pvVar3 = google::
             sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    pvVar3->second = uVar19;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_replace",dVar30,obj_size,start_memory_01,uVar14);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.table.groups);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&t);
  uVar26 = (ulong)uVar18;
  for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
             enlarge_threshold_ + uVar14 * 4) = (int)uVar14;
  }
  shuffle((vector<int,_std::allocator<int>_> *)&set);
  time_map_fetch<EasyUseSparseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_random");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&t);
  for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
             enlarge_threshold_ + uVar14 * 4) = (int)uVar14;
  }
  puVar16 = (undefined1 *)
            set.
            super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
            enlarge_threshold_;
  time_map_fetch<EasyUseSparseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_sequential");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t_3);
  Rusage::Reset(&t_3);
  uVar19 = 1;
  for (uVar27 = 0; uVar18 != uVar27; uVar27 = uVar27 + 1) {
    t_6.start_.__d.__r._4_4_ = (uVar27 & 0xff) * 0x1010101;
    puVar16 = (undefined1 *)((long)&t_6.start_.__d.__r + 4);
    t_6.start_.__d.__r._0_4_ = uVar27;
    google::
    sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
    ::find<HashObject<8,8>>
              ((iterator *)&t,
               (sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                *)&set,(HashObject<8,_8> *)&t_6);
    google::
    sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::end((iterator *)local_118,
          (sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
           *)&set);
    bVar1 = google::
            two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>_>
            ::operator!=(&tStack_170,&iStack_110);
    uVar19 = uVar19 ^ bVar1;
  }
  dVar30 = Rusage::UserTime(&t_3);
  srand(uVar19);
  report("map_fetch_empty",dVar30,obj_size,start_memory_02,(size_t)puVar16);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    pvVar3 = google::
             sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    pvVar3->second = uVar19;
  }
  Rusage::Reset(&t);
  for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    google::
    sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::erase((sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             *)&set,(key_type *)local_118);
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_remove",dVar30,obj_size,start_memory_03,(size_t)puVar16);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar19 = 0;
  uVar27 = uVar18;
  while( true ) {
    puVar17 = local_118 + 4;
    bVar1 = uVar27 == 0;
    uVar27 = uVar27 - 1;
    if (bVar1) break;
    acVar21 = (char  [4])((uVar19 & 0xff) * 0x1010101);
    local_118._4_4_ = acVar21;
    local_118._0_4_ = uVar19;
    pvVar3 = google::
             sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(key_type *)local_118);
    pvVar3->second = uVar19 + 1;
    google::
    sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::erase((sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             *)&set,(key_type *)local_118);
    puVar16 = puVar17;
    uVar19 = uVar19 + 1;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_toggle",dVar30,obj_size,start_memory_04,(size_t)puVar16);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t_6);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    t.start_.__d.__r._4_4_ = (uVar19 & 0xff) * 0x1010101;
    t.start_.__d.__r._0_4_ = uVar19;
    pvVar3 = google::
             sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(key_type *)&t);
    uVar19 = uVar19 + 1;
    pvVar3->second = uVar19;
  }
  Rusage::Reset(&t_6);
  google::
  sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::begin((iterator *)local_118,
          (sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
           *)&set);
  t.start_.__d.__r = (time_point)(time_point)local_118;
  tStack_170.row_begin._M_current = iStack_110.row_begin._M_current;
  tStack_170.row_end._M_current = iStack_110.row_end._M_current;
  tStack_170.row_current._M_current = iStack_110.row_current._M_current;
  tStack_170.col_current = iStack_110.col_current;
  iStack_150._M_current = iStack_f0._M_current;
  local_148._M_current = local_e8._M_current;
  iStack_140._M_current = iStack_e0._M_current;
  local_138 = local_d8;
  google::
  sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::end((iterator *)&t_3,
        (sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
         *)&set);
  local_118 = (undefined1  [8])t_3.start_.__d.__r;
  iStack_110.row_begin._M_current = iStack_70._M_current;
  iStack_110.row_end._M_current = local_68._M_current;
  uVar19 = 1;
  while( true ) {
    bVar1 = google::
            const_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>_>
            ::operator!=((const_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>_>
                          *)&tStack_170,(iterator *)&iStack_110);
    if (!bVar1) break;
    uVar19 = uVar19 ^ (tStack_170.col_current)->second;
    google::
    sparse_hashtable_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::operator++((sparse_hashtable_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                  *)&t);
  }
  dVar30 = Rusage::UserTime(&t_6);
  srand(uVar19);
  report("map_iterate",dVar30,obj_size,start_memory_05,(size_t)puVar16);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.table.groups);
  putchar(10);
  iVar2 = obj_size / 4;
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    uVar19 = (&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::kMapSizes)
             [lVar6];
    uVar27 = 1;
    while( true ) {
      if ((int)uVar19 < (int)uVar27) break;
      Rusage::Rusage(&t);
      iVar22 = iVar2 / (int)uVar19;
      EasyUseSparseHashMap<HashObject<8,_8>_*,_int,_HashFn>::EasyUseSparseHashMap
                ((EasyUseSparseHashMap<HashObject<8,_8>_*,_int,_HashFn> *)&set);
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      local_c8 = 0.0;
      iVar20 = 0;
      local_124 = iVar22;
      for (iVar23 = 0; iVar23 != local_124; iVar23 = iVar23 + 1) {
        google::
        sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
        ::clear((sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                 *)&set);
        google::
        sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
        ::resize((sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                  *)&set,(long)(int)uVar19);
        Rusage::Reset(&t);
        iVar22 = (int)uVar19 / (int)(0x7fffffff / (long)(int)uVar27);
        local_120 = iVar22 + 1;
        if (iVar22 < 0) {
          iVar22 = -1;
        }
        local_1e0 = (key_type)(long)(int)uVar27;
        for (lVar5 = 0; lVar5 != (long)iVar22 + 1; lVar5 = lVar5 + 1) {
          uVar14 = (long)(int)uVar19 / (long)local_120 & 0xffffffff;
          if ((int)((long)(int)uVar19 / (long)local_120) < 1) {
            uVar14 = 0;
          }
          local_11c = (int)uVar14 + iVar20;
          kVar28 = local_1e0;
          while( true ) {
            iVar20 = iVar20 + 1;
            iVar24 = (int)uVar14;
            uVar14 = (ulong)(iVar24 - 1);
            if (iVar24 == 0) break;
            local_118 = (undefined1  [8])kVar28;
            pvVar4 = google::
                     sparse_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
                     ::
                     find_or_insert<google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::DefaultValue>
                               ((sparse_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
                                 *)&set,(key_type *)local_118);
            pvVar4->second = iVar20;
            kVar28 = (key_type)((long)kVar28 + (long)(int)uVar27);
          }
          local_1e0 = (key_type)((long)local_1e0 + 1);
          iVar20 = local_11c;
        }
        dVar30 = Rusage::UserTime(&t);
        local_c8 = local_c8 + dVar30;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",
             local_c8 / (double)iVar20,(ulong)uVar19,(ulong)uVar27);
      std::
      vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
      ::~vector((vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                 *)&set.
                    super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                    .rep.table);
      uVar27 = uVar27 * uVar19;
    }
  }
  uVar19 = 0;
  sVar15 = (size_t)(uint)obj_size;
  printf("\n%s (%d byte objects, %d iterations):\n","DENSE_HASH_MAP",8);
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    pvVar7 = google::
             dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::find_or_insert<int,HashObject<8,8>>
                       ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(HashObject<8,_8> *)local_118);
    uVar19 = uVar19 + 1;
    pvVar7->second = uVar19;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_grow",dVar30,obj_size,start_memory_06,sVar15);
  free((void *)set.
               super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               .rep.table.settings.num_buckets);
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  google::
  dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::resize((dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)&set,req_elements);
  Rusage::Reset(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    pvVar7 = google::
             dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::find_or_insert<int,HashObject<8,8>>
                       ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(HashObject<8,_8> *)local_118);
    uVar19 = uVar19 + 1;
    pvVar7->second = uVar19;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_predict/grow",dVar30,obj_size,start_memory_07,sVar15);
  free((void *)set.
               super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               .rep.table.settings.num_buckets);
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    pvVar7 = google::
             dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::find_or_insert<int,HashObject<8,8>>
                       ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(HashObject<8,_8> *)local_118);
    uVar19 = uVar19 + 1;
    pvVar7->second = uVar19;
  }
  Rusage::Reset(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    pvVar7 = google::
             dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::find_or_insert<int,HashObject<8,8>>
                       ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(HashObject<8,_8> *)local_118);
    uVar19 = uVar19 + 1;
    pvVar7->second = uVar19;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_replace",dVar30,obj_size,start_memory_08,sVar15);
  free((void *)set.
               super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               .rep.table.settings.num_buckets);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&t);
  for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
             enlarge_threshold_ + uVar14 * 4) = (int)uVar14;
  }
  shuffle((vector<int,_std::allocator<int>_> *)&set);
  time_map_fetch<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_random");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&t);
  for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
             enlarge_threshold_ + uVar14 * 4) = (int)uVar14;
  }
  time_map_fetch<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_sequential");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t_3);
  Rusage::Reset(&t_3);
  uVar19 = 1;
  puVar16 = (undefined1 *)
            set.
            super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
            enlarge_threshold_;
  for (uVar27 = 0; uVar18 != uVar27; uVar27 = uVar27 + 1) {
    t_6.start_.__d.__r._4_4_ = (uVar27 & 0xff) * 0x1010101;
    t_6.start_.__d.__r._0_4_ = uVar27;
    google::
    dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
    ::find<HashObject<8,8>>
              ((iterator *)&t,
               (dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                *)&set,(HashObject<8,_8> *)&t_6);
    google::
    dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::end((iterator *)local_118,
          (dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
           *)&set);
    puVar16 = (undefined1 *)
              (ulong)(tStack_170.row_begin._M_current != iStack_110.row_begin._M_current);
    uVar19 = uVar19 ^ tStack_170.row_begin._M_current != iStack_110.row_begin._M_current;
  }
  dVar30 = Rusage::UserTime(&t_3);
  srand(uVar19);
  report("map_fetch_empty",dVar30,obj_size,start_memory_09,(size_t)puVar16);
  free((void *)set.
               super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               .rep.table.settings.num_buckets);
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    pvVar7 = google::
             dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::find_or_insert<int,HashObject<8,8>>
                       ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(HashObject<8,_8> *)local_118);
    uVar19 = uVar19 + 1;
    pvVar7->second = uVar19;
  }
  Rusage::Reset(&t);
  for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    google::
    dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::erase((dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             *)&set,(key_type *)local_118);
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_remove",dVar30,obj_size,start_memory_10,(size_t)puVar16);
  free((void *)set.
               super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               .rep.table.settings.num_buckets);
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar19 = uVar18;
  uVar27 = 0;
  while( true ) {
    puVar17 = local_118 + 4;
    bVar1 = uVar19 == 0;
    uVar19 = uVar19 - 1;
    if (bVar1) break;
    acVar21 = (char  [4])((uVar27 & 0xff) * 0x1010101);
    local_118._4_4_ = acVar21;
    local_118._0_4_ = uVar27;
    pvVar7 = google::
             dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::find_or_insert<int,HashObject<8,8>>
                       ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(HashObject<8,_8> *)local_118);
    pvVar7->second = uVar27 + 1;
    google::
    dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::erase((dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             *)&set,(HashObject<8,_8> *)local_118);
    puVar16 = puVar17;
    uVar27 = uVar27 + 1;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_toggle",dVar30,obj_size,start_memory_11,(size_t)puVar16);
  free((void *)set.
               super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               .rep.table.settings.num_buckets);
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t_3);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    puVar16 = (undefined1 *)((long)&t.start_.__d.__r + 4);
    t.start_.__d.__r._4_4_ = (uVar19 & 0xff) * 0x1010101;
    t.start_.__d.__r._0_4_ = uVar19;
    pvVar7 = google::
             dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
             ::find_or_insert<int,HashObject<8,8>>
                       ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                         *)&set,(HashObject<8,_8> *)&t);
    uVar19 = uVar19 + 1;
    pvVar7->second = uVar19;
  }
  Rusage::Reset(&t_3);
  google::
  dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::begin((iterator *)local_118,
          (dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
           *)&set);
  t.start_.__d.__r = (time_point)(time_point)local_118;
  tStack_170.row_begin._M_current = iStack_110.row_begin._M_current;
  tStack_170.row_end._M_current = iStack_110.row_end._M_current;
  google::
  dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::end((iterator *)local_118,
        (dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
         *)&set);
  uVar19 = 1;
  while( true ) {
    if (tStack_170.row_begin._M_current == iStack_110.row_begin._M_current) break;
    uVar27._0_2_ = (tStack_170.row_begin._M_current)->settings;
    uVar27._2_1_ = (tStack_170.row_begin._M_current)->bitmap[0];
    uVar27._3_1_ = (tStack_170.row_begin._M_current)->bitmap[1];
    uVar19 = uVar19 ^ uVar27;
    google::
    dense_hashtable_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::operator++((dense_hashtable_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                  *)&t);
  }
  dVar30 = Rusage::UserTime(&t_3);
  srand(uVar19);
  report("map_iterate",dVar30,obj_size,start_memory_12,(size_t)puVar16);
  free((void *)set.
               super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               .rep.table.settings.num_buckets);
  putchar(10);
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    uVar19 = (&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::kMapSizes)
             [lVar6];
    uVar27 = 1;
    while( true ) {
      if ((int)uVar19 < (int)uVar27) break;
      Rusage::Rusage(&t);
      iVar20 = iVar2 / (int)uVar19;
      EasyUseDenseHashMap<HashObject<8,_8>_*,_int,_HashFn>::EasyUseDenseHashMap
                ((EasyUseDenseHashMap<HashObject<8,_8>_*,_int,_HashFn> *)&set);
      iVar22 = 0;
      if (iVar20 < 1) {
        iVar20 = 0;
      }
      local_b8 = 0.0;
      iVar23 = 0;
      local_124 = iVar20;
      while( true ) {
        local_c8 = (double)CONCAT44(local_c8._4_4_,iVar22);
        if (iVar22 == local_124) break;
        google::
        dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
        ::clear((dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                 *)&set);
        google::
        dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
        ::resize((dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                  *)&set,(long)(int)uVar19);
        Rusage::Reset(&t);
        iVar22 = (int)uVar19 / (int)(0x7fffffff / (long)(int)uVar27);
        local_120 = iVar22 + 1;
        if (iVar22 < 0) {
          iVar22 = -1;
        }
        local_1e0 = (key_type)(long)(int)uVar27;
        for (lVar5 = 0; lVar5 != (long)iVar22 + 1; lVar5 = lVar5 + 1) {
          iVar20 = (int)uVar19 / local_120;
          if (iVar20 < 1) {
            iVar20 = 0;
          }
          local_11c = iVar20 + iVar23;
          kVar28 = local_1e0;
          while( true ) {
            iVar23 = iVar23 + 1;
            bVar1 = iVar20 == 0;
            iVar20 = iVar20 + -1;
            if (bVar1) break;
            local_118 = (undefined1  [8])kVar28;
            pvVar8 = google::
                     dense_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
                     ::find_or_insert<int,HashObject<8,8>*>
                               ((dense_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
                                 *)&set,(HashObject<8,_8> **)local_118);
            pvVar8->second = iVar23;
            kVar28 = (key_type)((long)kVar28 + (long)(int)uVar27);
          }
          local_1e0 = (key_type)((long)local_1e0 + 1);
          iVar23 = local_11c;
        }
        dVar30 = Rusage::UserTime(&t);
        local_b8 = local_b8 + dVar30;
        iVar22 = local_c8._0_4_ + 1;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",
             local_b8 / (double)iVar23,(ulong)uVar19,(ulong)uVar27);
      free((void *)set.
                   super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                   .rep.table.settings.num_buckets);
      uVar27 = uVar27 * uVar19;
    }
  }
  uVar19 = 0;
  sVar15 = (size_t)(uint)obj_size;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD HASH_MAP",8);
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        .rep.table;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_empty_ =
       false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_deleted_
       = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._27_1_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.table.groups.
  super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    puVar9 = (uint *)std::__detail::
                     _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    *puVar9 = uVar19;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_grow",dVar30,obj_size,start_memory_13,sVar15);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        .rep.table;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_empty_ =
       false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_deleted_
       = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._27_1_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.table.groups.
  super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Rusage::Rusage(&t);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)&set,req_elements);
  Rusage::Reset(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    puVar9 = (uint *)std::__detail::
                     _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    *puVar9 = uVar19;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_predict/grow",dVar30,obj_size,start_memory_14,sVar15);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        .rep.table;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_empty_ =
       false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_deleted_
       = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._27_1_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.table.groups.
  super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Rusage::Rusage(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    puVar9 = (uint *)std::__detail::
                     _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    *puVar9 = uVar19;
  }
  Rusage::Reset(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    puVar9 = (uint *)std::__detail::
                     _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    *puVar9 = uVar19;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_replace",dVar30,obj_size,start_memory_15,sVar15);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&t);
  for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
             enlarge_threshold_ + uVar14 * 4) = (int)uVar14;
  }
  shuffle((vector<int,_std::allocator<int>_> *)&set);
  time_map_fetch<EasyUseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_random");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&t);
  for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
             enlarge_threshold_ + uVar14 * 4) = (int)uVar14;
  }
  puVar16 = (undefined1 *)
            set.
            super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
            enlarge_threshold_;
  time_map_fetch<EasyUseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_sequential");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        .rep.table;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_empty_ =
       false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_deleted_
       = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._27_1_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.table.groups.
  super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar19 = 1;
  for (uVar27 = 0; uVar18 != uVar27; uVar27 = uVar27 + 1) {
    local_118._4_4_ = (uVar27 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar27;
    iVar10 = std::
             _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&set,(key_type *)local_118);
    puVar16 = (undefined1 *)
              (ulong)(iVar10.super__Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true>
                      ._M_cur != (__node_type *)0x0);
    uVar19 = uVar19 ^ iVar10.super__Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true>
                      ._M_cur != (__node_type *)0x0;
  }
  dVar30 = Rusage::UserTime(&t);
  srand(uVar19);
  report("map_fetch_empty",dVar30,obj_size,start_memory_16,(size_t)puVar16);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        .rep.table;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_empty_ =
       false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_deleted_
       = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._27_1_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.table.groups.
  super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Rusage::Rusage(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    puVar9 = (uint *)std::__detail::
                     _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    *puVar9 = uVar19;
  }
  Rusage::Reset(&t);
  for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    std::
    _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&set,local_118);
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_remove",dVar30,obj_size,start_memory_17,(size_t)puVar16);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        .rep.table;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_empty_ =
       false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_deleted_
       = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._27_1_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.table.groups.
  super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar19 = uVar18;
  uVar27 = 0;
  while( true ) {
    puVar17 = local_118 + 4;
    bVar1 = uVar19 == 0;
    uVar19 = uVar19 - 1;
    if (bVar1) break;
    acVar21 = (char  [4])((uVar27 & 0xff) * 0x1010101);
    local_118._4_4_ = acVar21;
    local_118._0_4_ = uVar27;
    puVar9 = (uint *)std::__detail::
                     _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,(key_type *)local_118);
    *puVar9 = uVar27 + 1;
    std::
    _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&set,(key_type *)local_118);
    puVar16 = puVar17;
    uVar27 = uVar27 + 1;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_toggle",dVar30,obj_size,start_memory_18,(size_t)puVar16);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        .rep.table;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_empty_ =
       false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.use_deleted_
       = false;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._27_1_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.table.groups.
  super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Rusage::Rusage(&t);
  pfVar29 = &set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
             enlarge_factor_;
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    puVar9 = (uint *)std::__detail::
                     _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    *puVar9 = uVar19;
  }
  Rusage::Reset(&t);
  uVar19 = 1;
  while( true ) {
    pfVar29 = *(float **)pfVar29;
    if (pfVar29 == (float *)0x0) break;
    uVar19 = uVar19 ^ (uint)pfVar29[4];
  }
  dVar30 = Rusage::UserTime(&t);
  srand(uVar19);
  report("map_iterate",dVar30,obj_size,start_memory_19,(size_t)puVar16);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  putchar(10);
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    uVar19 = (&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::kMapSizes)
             [lVar6];
    uVar27 = 1;
    while( true ) {
      if ((int)uVar19 < (int)uVar27) break;
      Rusage::Rusage(&t);
      local_124 = iVar2 / (int)uVar19;
      set.
      super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
      enlarge_threshold_ =
           (size_type)
           &set.
            super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            .rep.table;
      set.
      super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
      shrink_threshold_ = 1;
      set.
      super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
      enlarge_factor_ = 0.0;
      set.
      super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
      shrink_factor_ = 0.0;
      set.
      super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
      consider_shrink_ = false;
      set.
      super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
      use_empty_ = false;
      set.
      super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
      use_deleted_ = false;
      set.
      super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._27_1_ =
           0;
      set.
      super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
      num_ht_copies_ = 0;
      set.
      super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      .rep.key_info.delkey.i_ = 0x3f800000;
      set.
      super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      .rep.num_deleted = 0;
      set.
      super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      .rep.table.groups.
      super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      iVar22 = 0;
      if (local_124 < 1) {
        local_124 = 0;
      }
      local_c8 = 0.0;
      iVar20 = 0;
      while( true ) {
        if (iVar22 == local_124) break;
        std::
        _Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::clear((_Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
        std::
        _Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::rehash((_Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&set,(long)(int)uVar19);
        Rusage::Reset(&t);
        iVar23 = (int)uVar19 / (int)(0x7fffffff / (long)(int)uVar27);
        local_120 = iVar23 + 1;
        if (iVar23 < 0) {
          iVar23 = -1;
        }
        local_1e0 = (key_type)(long)(int)uVar27;
        for (lVar5 = 0; lVar5 != (long)iVar23 + 1; lVar5 = lVar5 + 1) {
          uVar14 = (long)(int)uVar19 / (long)local_120 & 0xffffffff;
          if ((int)((long)(int)uVar19 / (long)local_120) < 1) {
            uVar14 = 0;
          }
          local_11c = (int)uVar14 + iVar20;
          kVar28 = local_1e0;
          while( true ) {
            iVar20 = iVar20 + 1;
            iVar24 = (int)uVar14;
            uVar14 = (ulong)(iVar24 - 1);
            if (iVar24 == 0) break;
            local_118 = (undefined1  [8])kVar28;
            pmVar11 = std::__detail::
                      _Map_base<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&set,(key_type *)local_118);
            *pmVar11 = iVar20;
            kVar28 = (key_type)((long)kVar28 + (long)(int)uVar27);
          }
          local_1e0 = (key_type)((long)local_1e0 + 1);
          iVar20 = local_11c;
        }
        dVar30 = Rusage::UserTime(&t);
        local_c8 = local_c8 + dVar30;
        iVar22 = iVar22 + 1;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",
             local_c8 / (double)iVar20,(ulong)uVar19,(ulong)uVar27);
      std::
      _Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&set);
      uVar27 = uVar27 * uVar19;
    }
  }
  uVar19 = 0;
  sVar15 = (size_t)(uint)obj_size;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD MAP",8);
  psVar25 = &set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
             shrink_threshold_;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._24_8_ =
       psVar25;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey = (type)psVar25;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    puVar9 = (uint *)std::
                     map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                     ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                   *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    *puVar9 = uVar19;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_grow",dVar30,obj_size,start_memory_20,sVar15);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)&set);
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._24_8_ =
       psVar25;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey = (type)psVar25;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    puVar9 = (uint *)std::
                     map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                     ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                   *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    *puVar9 = uVar19;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_predict/grow",dVar30,obj_size,start_memory_21,sVar15);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)&set);
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._24_8_ =
       psVar25;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey = (type)psVar25;
  Rusage::Rusage(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    puVar9 = (uint *)std::
                     map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                     ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                   *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    *puVar9 = uVar19;
  }
  Rusage::Reset(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    puVar9 = (uint *)std::
                     map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                     ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                   *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    *puVar9 = uVar19;
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_replace",dVar30,obj_size,start_memory_22,sVar15);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&t);
  for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
             enlarge_threshold_ + uVar14 * 4) = (int)uVar14;
  }
  shuffle((vector<int,_std::allocator<int>_> *)&set);
  time_map_fetch<EasyUseMap<HashObject<8,8>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_random");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)&t);
  for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
             enlarge_threshold_ + uVar14 * 4) = (int)uVar14;
  }
  end_memory = set.
               super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>
               .enlarge_threshold_;
  time_map_fetch<EasyUseMap<HashObject<8,8>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_sequential");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._24_8_ =
       psVar25;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey = (type)psVar25;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar19 = 1;
  for (uVar27 = 0; uVar18 != uVar27; uVar27 = uVar27 + 1) {
    local_118._4_4_ = (uVar27 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar27;
    iVar12 = std::
             _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
             ::find((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                     *)&set,(key_type *)local_118);
    end_memory = (size_type)(iVar12._M_node != (_Base_ptr)psVar25);
    uVar19 = uVar19 ^ iVar12._M_node != (_Base_ptr)psVar25;
  }
  dVar30 = Rusage::UserTime(&t);
  srand(uVar19);
  report("map_fetch_empty",dVar30,obj_size,start_memory_23,end_memory);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)&set);
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._24_8_ =
       psVar25;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey = (type)psVar25;
  Rusage::Rusage(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    puVar9 = (uint *)std::
                     map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                     ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                   *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    *puVar9 = uVar19;
  }
  Rusage::Reset(&t);
  for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    std::
    _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::erase((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
             *)&set,(key_type *)local_118);
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_remove",dVar30,obj_size,start_memory_24,end_memory);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)&set);
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._24_8_ =
       psVar25;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey = (type)psVar25;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  sVar15 = 0;
  uVar19 = uVar18;
  while( true ) {
    psVar25 = &set.
               super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>
               .shrink_threshold_;
    bVar1 = uVar19 == 0;
    uVar19 = uVar19 - 1;
    if (bVar1) break;
    uVar27 = (uint)sVar15;
    acVar21 = (char  [4])((uVar27 & 0xff) * 0x1010101);
    local_118._4_4_ = acVar21;
    local_118._0_4_ = uVar27;
    puVar9 = (uint *)std::
                     map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                     ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                   *)&set,(key_type *)local_118);
    *puVar9 = uVar27 + 1;
    std::
    _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::erase((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
             *)&set,(key_type *)local_118);
    sVar15 = (size_t)(uVar27 + 1);
  }
  dVar30 = Rusage::UserTime(&t);
  report("map_toggle",dVar30,obj_size,start_memory_25,sVar15);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)&set);
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._24_8_ =
       psVar25;
  set.
  super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  .rep.key_info.delkey = (type)psVar25;
  Rusage::Rusage(&t);
  uVar19 = 0;
  while (uVar18 != uVar19) {
    local_118._4_4_ = (uVar19 & 0xff) * 0x1010101;
    local_118._0_4_ = uVar19;
    puVar9 = (uint *)std::
                     map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                     ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                   *)&set,(key_type *)local_118);
    uVar19 = uVar19 + 1;
    *puVar9 = uVar19;
  }
  Rusage::Reset(&t);
  uVar18 = 1;
  for (p_Var13 = (_Rb_tree_node_base *)
                 set.
                 super_sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                 .rep.settings.
                 super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>._24_8_;
      p_Var13 != (_Rb_tree_node_base *)psVar25;
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    uVar18 = uVar18 ^ *(uint *)((long)(p_Var13 + 1) + 8);
  }
  dVar30 = Rusage::UserTime(&t);
  srand(uVar18);
  report("map_iterate",dVar30,obj_size,start_memory_26,sVar15);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)&set);
  return;
}

Assistant:

static void test_all_maps(int obj_size, int iters) {
  const bool stress_hash_function = obj_size <= 8;

  if (FLAGS_test_sparse_hash_map)
    measure_map<EasyUseSparseHashMap<ObjType, int, HashFn>,
                EasyUseSparseHashMap<ObjType*, int, HashFn>>(
        "SPARSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_dense_hash_map)
    measure_map<EasyUseDenseHashMap<ObjType, int, HashFn>,
                EasyUseDenseHashMap<ObjType*, int, HashFn>>(
        "DENSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_hash_map)
    measure_map<EasyUseHashMap<ObjType, int, HashFn>,
                EasyUseHashMap<ObjType*, int, HashFn>>(
        "STANDARD HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_map)
    measure_map<EasyUseMap<ObjType, int>, EasyUseMap<ObjType*, int>>(
        "STANDARD MAP", obj_size, iters, false);
}